

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall QUrlModel::layoutChanged(QUrlModel *this)

{
  bool bVar1;
  iterator o;
  QString *path_00;
  QModelIndex *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QString *path;
  QStringList *__range1_1;
  WatchItem *item;
  add_const_t<QList<QUrlModel::WatchItem>_> *__range1;
  QModelIndex newIndex;
  iterator __end1_1;
  iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList paths;
  rvalue_ref in_stack_ffffffffffffff28;
  QList<QUrlModel::WatchItem> *in_stack_ffffffffffffff30;
  QUrlModel *this_01;
  QList<QString> *in_stack_ffffffffffffff58;
  qsizetype in_stack_ffffffffffffff98;
  iterator local_40;
  WatchItem *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  QFileSystemModel *local_8;
  
  local_8 = *(QFileSystemModel **)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x7862a5);
  QList<QUrlModel::WatchItem>::size((QList<QUrlModel::WatchItem> *)(in_RDI + 0x20));
  QList<QString>::reserve(in_stack_ffffffffffffff58,in_stack_ffffffffffffff98);
  local_28.i = (WatchItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QUrlModel::WatchItem>::begin(in_stack_ffffffffffffff30);
  local_30.i = (WatchItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QUrlModel::WatchItem>::end(in_stack_ffffffffffffff30);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QUrlModel::WatchItem>::const_iterator::operator!=(&local_28,local_30);
    if (!bVar1) break;
    QList<QUrlModel::WatchItem>::const_iterator::operator*(&local_28);
    QList<QString>::append
              ((QList<QString> *)in_stack_ffffffffffffff30,(parameter_type)in_stack_ffffffffffffff28
              );
    QList<QUrlModel::WatchItem>::const_iterator::operator++(&local_28);
  }
  QList<QUrlModel::WatchItem>::clear(in_stack_ffffffffffffff30);
  this_01 = (QUrlModel *)&local_20;
  local_40.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffff30);
  o = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffff30);
  while (bVar1 = QList<QString>::iterator::operator!=(&local_40,o), bVar1) {
    path_00 = QList<QString>::iterator::operator*(&local_40);
    QFileSystemModel::index((QString *)&stack0xffffffffffffff98,(int)*(undefined8 *)(in_RDI + 0x18))
    ;
    this_00 = (QModelIndex *)(in_RDI + 0x20);
    QString::QString((QString *)this_00,(QString *)in_stack_ffffffffffffff28);
    QList<QUrlModel::WatchItem>::append
              ((QList<QUrlModel::WatchItem> *)this_00,in_stack_ffffffffffffff28);
    WatchItem::~WatchItem((WatchItem *)0x7864ed);
    bVar1 = QModelIndex::isValid(this_00);
    if (bVar1) {
      changed(this_01,path_00);
    }
    QList<QString>::iterator::operator++(&local_40);
  }
  QList<QString>::~QList((QList<QString> *)0x78652d);
  if (*(QFileSystemModel **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::layoutChanged()
{
    QStringList paths;
    paths.reserve(watching.size());
    for (const WatchItem &item : std::as_const(watching))
        paths.append(item.path);
    watching.clear();
    for (const auto &path : paths) {
        QModelIndex newIndex = fileSystemModel->index(path);
        watching.append({newIndex, path});
        if (newIndex.isValid())
            changed(path);
     }
}